

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_test.cc
# Opt level: O3

void TestCertReparse(Span<const_unsigned_char> der)

{
  OPENSSL_STACK *pOVar1;
  int iVar2;
  size_t sVar3;
  X509 *pXVar4;
  X509 *pXVar5;
  PKCS7 *__p;
  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  initial_capacity;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var6;
  AssertHelperData *pAVar7;
  undefined1 auVar8 [8];
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar9;
  char *pcVar10;
  char *in_R9;
  ulong uVar11;
  pointer *__ptr;
  UniquePtr<uint8_t> free_result2_data;
  UniquePtr<uint8_t> free_result_data;
  UniquePtr<struct_stack_st_X509> certs;
  uint8_t *result4_data;
  uint8_t *result3_data;
  UniquePtr<PKCS7> pkcs7_obj;
  UniquePtr<struct_stack_st_X509> certs2;
  CBS pkcs7;
  ScopedCBB cbb;
  size_t result_len;
  uint8_t *result_data;
  int result4_len;
  int result3_len;
  UniquePtr<uint8_t> free_result4_data;
  UniquePtr<uint8_t> free_result3_data;
  uint8_t *ptr;
  size_t result2_len;
  uint8_t *result2_data;
  undefined1 local_130 [8];
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  Bytes local_120;
  undefined1 local_110 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  __uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter> local_f0;
  __uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter> local_e8;
  _Head_base<0UL,_stack_st_X509_*,_false> local_e0;
  AssertHelper local_d8;
  AssertHelper local_d0;
  _Head_base<0UL,_PKCS7_*,_false> local_c8;
  _Head_base<0UL,_stack_st_X509_*,_false> local_c0;
  CBS local_b8;
  undefined1 local_a8 [16];
  anon_union_32_2_4f6aaa2e_for_u local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  int local_68;
  int local_64;
  AssertHelperData *local_60;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_58;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_50;
  AssertHelperData *local_48;
  size_t local_40;
  _Head_base<0UL,_unsigned_char_*,_false> local_38;
  
  initial_capacity.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )der.size_;
  pAVar7 = (AssertHelperData *)der.data_;
  local_e0._M_head_impl = (stack_st_X509 *)OPENSSL_sk_new_null();
  local_110[0] = (internal)((OPENSSL_STACK *)local_e0._M_head_impl != (OPENSSL_STACK *)0x0);
  local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  if ((OPENSSL_STACK *)local_e0._M_head_impl == (OPENSSL_STACK *)0x0) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_110,(AssertionResult *)0x5add24,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0x59,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_130,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_130);
    if ((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
      operator_delete((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(local_a8._1_7_,local_a8[0]),
                      (ulong)(local_98.base.buf + 1));
    }
    if ((AssertHelperData *)local_b8.data != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b8.data + 8))();
    }
    if (local_108 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    }
    goto LAB_0033c059;
  }
  local_c0._M_head_impl = (stack_st_X509 *)OPENSSL_sk_new_null();
  local_110[0] = (internal)((OPENSSL_STACK *)local_c0._M_head_impl != (OPENSSL_STACK *)0x0);
  local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  if ((OPENSSL_STACK *)local_c0._M_head_impl == (OPENSSL_STACK *)0x0) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_110,(AssertionResult *)"certs2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0x5b,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_130,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_130);
    auVar8 = (undefined1  [8])local_b8.data;
    if ((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
      operator_delete((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(local_a8._1_7_,local_a8[0]),
                      (ulong)(local_98.base.buf + 1));
      auVar8 = (undefined1  [8])local_b8.data;
    }
LAB_0033b8ae:
    if (auVar8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)auVar8 + 8))();
    }
    if (local_108 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    }
  }
  else {
    local_b8.data = (uint8_t *)pAVar7;
    local_b8.len = (size_t)initial_capacity.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
    iVar2 = PKCS7_get_certificates(local_e0._M_head_impl,&local_b8);
    local_110[0] = (internal)(iVar2 != 0);
    local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)local_130);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a8,(internal *)local_110,
                 (AssertionResult *)"PKCS7_get_certificates(certs.get(), &pkcs7)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_120,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,0x60,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)local_130);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
      auVar8 = local_130;
      if ((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
        operator_delete((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(local_a8._1_7_,local_a8[0]),
                        (ulong)(local_98.base.buf + 1));
        auVar8 = local_130;
      }
      goto LAB_0033b8ae;
    }
    local_130 = (undefined1  [8])((ulong)local_130 & 0xffffffff00000000);
    local_110 = (undefined1  [8])local_b8.len;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_a8,"0u","CBS_len(&pkcs7)",(uint *)local_130,
               (unsigned_long *)local_110);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = ((_Alloc_hider *)local_a8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,0x61,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_130,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_130);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_110 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_a8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_a8._8_8_);
    }
    CBB_zero((CBB *)local_a8);
    iVar2 = CBB_init((CBB *)local_a8,
                     (size_t)initial_capacity.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
    local_130[0] = iVar2 != 0;
    local_128._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_130,
                 (AssertionResult *)"CBB_init(cbb.get(), der.size())","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,100,(char *)local_110);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
LAB_0033bb96:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if (local_110 != (undefined1  [8])&local_100) {
        operator_delete((void *)local_110,local_100._M_allocated_capacity + 1);
      }
      if ((AssertHelperData *)local_120.span_.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_120.span_.data_ + 8))();
      }
      if (local_128._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_128,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_128._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
      }
    }
    else {
      iVar2 = PKCS7_bundle_certificates((CBB *)local_a8,local_e0._M_head_impl);
      local_130[0] = iVar2 != 0;
      local_128._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_120);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_110,(internal *)local_130,
                   (AssertionResult *)"PKCS7_bundle_certificates(cbb.get(), certs.get())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x65,(char *)local_110);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
        goto LAB_0033bb96;
      }
      iVar2 = CBB_finish((CBB *)local_a8,(uint8_t **)&local_70,(size_t *)&local_78);
      local_130[0] = iVar2 != 0;
      local_128._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_120);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_110,(internal *)local_130,
                   (AssertionResult *)"CBB_finish(cbb.get(), &result_data, &result_len)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x66,(char *)local_110);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
        goto LAB_0033bb96;
      }
      local_e8._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (tuple<unsigned_char_*,_bssl::internal::Deleter>)
           (tuple<unsigned_char_*,_bssl::internal::Deleter>)local_70._M_head_impl;
      local_b8.data = (uint8_t *)local_70._M_head_impl;
      local_b8.len = (size_t)local_78;
      iVar2 = PKCS7_get_certificates(local_c0._M_head_impl,&local_b8);
      local_130[0] = iVar2 != 0;
      local_128._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_120);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_110,(internal *)local_130,
                   (AssertionResult *)"PKCS7_get_certificates(certs2.get(), &pkcs7)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x6a,(char *)local_110);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_120);
        goto LAB_0033bc48;
      }
      local_120.span_.data_ = (uchar *)((ulong)local_120.span_.data_ & 0xffffffff00000000);
      local_130 = (undefined1  [8])local_b8.len;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_110,"0u","CBS_len(&pkcs7)",(uint *)&local_120,
                 (unsigned_long *)local_130);
      if (local_110[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_130);
        if (local_108 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (char *)local_108->_M_allocated_capacity;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_120,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x6b,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)local_130);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
        if (local_130 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_130 + 8))();
        }
      }
      if (local_108 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
        ;
      }
      local_130 = (undefined1  [8])OPENSSL_sk_num((OPENSSL_STACK *)local_e0._M_head_impl);
      local_120.span_.data_ = (uchar *)OPENSSL_sk_num((OPENSSL_STACK *)local_c0._M_head_impl);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_110,"sk_X509_num(certs.get())","sk_X509_num(certs2.get())",
                 (unsigned_long *)local_130,(unsigned_long *)&local_120);
      if (local_110[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_130);
        if (local_108 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (char *)local_108->_M_allocated_capacity;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_120,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x70,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)local_130);
LAB_0033c00a:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
        if (local_130 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_130 + 8))();
        }
        if (local_108 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_108;
          _Var6._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )local_108;
          goto LAB_0033c033;
        }
      }
      else {
        local_60 = pAVar7;
        if (local_108 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_108,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108);
        }
        for (uVar11 = 0; sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)local_e0._M_head_impl),
            uVar11 < sVar3; uVar11 = uVar11 + 1) {
          pXVar4 = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)local_e0._M_head_impl,uVar11);
          pXVar5 = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)local_c0._M_head_impl,uVar11);
          local_130 = (undefined1  [8])((ulong)local_130 & 0xffffffff00000000);
          iVar2 = X509_cmp(pXVar4,pXVar5);
          local_120.span_.data_ = (uchar *)CONCAT44(local_120.span_.data_._4_4_,iVar2);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_110,"0","X509_cmp(a, b)",(int *)local_130,(int *)&local_120);
          if (local_110[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_130);
            if (local_108 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = (char *)local_108->_M_allocated_capacity;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_120,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                       ,0x74,pcVar10);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_120,(Message *)local_130);
            goto LAB_0033c00a;
          }
          if (local_108 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108);
          }
        }
        iVar2 = CBB_init((CBB *)local_a8,
                         (size_t)initial_capacity.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
        pAVar7 = local_60;
        local_130[0] = iVar2 != 0;
        local_128._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_110,(internal *)local_130,
                     (AssertionResult *)"CBB_init(cbb.get(), der.size())","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_f0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                     ,0x77,(char *)local_110);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_f0,(Message *)&local_120);
        }
        else {
          iVar2 = PKCS7_bundle_certificates((CBB *)local_a8,local_c0._M_head_impl);
          local_130[0] = iVar2 != 0;
          local_128._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (iVar2 == 0) {
            testing::Message::Message((Message *)&local_120);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_110,(internal *)local_130,
                       (AssertionResult *)"PKCS7_bundle_certificates(cbb.get(), certs2.get())",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_f0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                       ,0x78,(char *)local_110);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_f0,(Message *)&local_120);
          }
          else {
            iVar2 = CBB_finish((CBB *)local_a8,&local_38._M_head_impl,&local_40);
            local_130[0] = iVar2 != 0;
            local_128._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (iVar2 != 0) {
              local_f0._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                   (tuple<unsigned_char_*,_bssl::internal::Deleter>)
                   (tuple<unsigned_char_*,_bssl::internal::Deleter>)local_38._M_head_impl;
              local_130 = (undefined1  [8])local_70._M_head_impl;
              local_128._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )local_78;
              local_120.span_.data_ = local_38._M_head_impl;
              local_120.span_.size_ = local_40;
              testing::internal::CmpHelperEQ<Bytes,Bytes>
                        ((internal *)local_110,"Bytes(result_data, result_len)",
                         "Bytes(result2_data, result2_len)",(Bytes *)local_130,&local_120);
              if (local_110[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_130);
                if (local_108 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  pcVar10 = "";
                }
                else {
                  pcVar10 = (char *)local_108->_M_allocated_capacity;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_120,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                           ,0x7c,pcVar10);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_120,(Message *)local_130);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
                if (local_130 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_130 + 8))();
                }
              }
              if (local_108 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_108,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108);
              }
              local_48 = pAVar7;
              local_c8._M_head_impl =
                   (PKCS7 *)d2i_PKCS7((PKCS7 **)0x0,(uchar **)&local_48,
                                      (long)initial_capacity.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl);
              local_130[0] = (PKCS7 *)local_c8._M_head_impl != (PKCS7 *)0x0;
              local_128._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if ((PKCS7 *)local_c8._M_head_impl == (PKCS7 *)0x0) {
                testing::Message::Message((Message *)&local_120);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_110,(internal *)local_130,(AssertionResult *)"pkcs7_obj",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_d0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                           ,0x81,(char *)local_110);
                testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_120);
LAB_0033c465:
                pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_128;
                testing::internal::AssertHelper::~AssertHelper(&local_d0);
                if (local_110 != (undefined1  [8])&local_100) {
                  operator_delete((void *)local_110,local_100._M_allocated_capacity + 1);
                }
                if ((AssertHelperData *)local_120.span_.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_120.span_.data_ + 8))();
                }
                _Var6._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )local_128;
                if (local_128._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl !=
                    (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
LAB_0033c69d:
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(pdVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)_Var6._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl);
                }
              }
              else {
                local_130 = (undefined1  [8])
                            ((long)&pAVar7->type +
                            (long)initial_capacity.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl);
                testing::internal::CmpHelperEQ<unsigned_char_const*,unsigned_char_const*>
                          ((internal *)local_110,"ptr","der.data() + der.size()",(uchar **)&local_48
                           ,(uchar **)local_130);
                if (local_110[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_130);
                  if (local_108 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    pcVar10 = "";
                  }
                  else {
                    pcVar10 = (char *)local_108->_M_allocated_capacity;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_120,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                             ,0x82,pcVar10);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_120,(Message *)local_130);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
                  if (local_130 != (undefined1  [8])0x0) {
                    (**(code **)(*(long *)local_130 + 8))();
                  }
                }
                if (local_108 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_108,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_108);
                }
                iVar2 = PKCS7_type_is_signed(local_c8._M_head_impl);
                local_130[0] = iVar2 != 0;
                local_128._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                if (iVar2 == 0) {
                  testing::Message::Message((Message *)&local_120);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_110,(internal *)local_130,
                             (AssertionResult *)"PKCS7_type_is_signed(pkcs7_obj.get())","false",
                             "true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_d0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                             ,0x84,(char *)local_110);
                  testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_120);
                  goto LAB_0033c465;
                }
                pOVar1 = (OPENSSL_STACK *)((ASN1_OBJECT *)((local_c8._M_head_impl)->d).sign)->sn;
                local_130 = (undefined1  [8])OPENSSL_sk_num((OPENSSL_STACK *)local_e0._M_head_impl);
                local_120.span_.data_ = (uchar *)OPENSSL_sk_num(pOVar1);
                testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                          ((internal *)local_110,"sk_X509_num(certs.get())","sk_X509_num(certs3)",
                           (unsigned_long *)local_130,(unsigned_long *)&local_120);
                if (local_110[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_130);
                  if (local_108 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    pcVar10 = "";
                  }
                  else {
                    pcVar10 = (char *)local_108->_M_allocated_capacity;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_120,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                             ,0x86,pcVar10);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_120,(Message *)local_130);
LAB_0033c674:
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
                  if (local_130 != (undefined1  [8])0x0) {
                    (**(code **)(*(long *)local_130 + 8))();
                  }
                  if (local_108 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) goto LAB_0033c6a2;
                  pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_108;
                  _Var6._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )local_108;
                  goto LAB_0033c69d;
                }
                if (local_108 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_108,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_108);
                }
                for (uVar11 = 0; sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)local_e0._M_head_impl),
                    uVar11 < sVar3; uVar11 = uVar11 + 1) {
                  pXVar4 = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)local_e0._M_head_impl,uVar11);
                  pXVar5 = (X509 *)OPENSSL_sk_value(pOVar1,uVar11);
                  local_130 = (undefined1  [8])((ulong)local_130 & 0xffffffff00000000);
                  iVar2 = X509_cmp(pXVar4,pXVar5);
                  local_120.span_.data_ = (uchar *)CONCAT44(local_120.span_.data_._4_4_,iVar2);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_110,"0","X509_cmp(a, b)",(int *)local_130,
                             (int *)&local_120);
                  if (local_110[0] == (internal)0x0) {
                    testing::Message::Message((Message *)local_130);
                    if (local_108 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      pcVar10 = "";
                    }
                    else {
                      pcVar10 = (char *)local_108->_M_allocated_capacity;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_120,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                               ,0x8a,pcVar10);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_120,(Message *)local_130);
                    goto LAB_0033c674;
                  }
                  if (local_108 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_108,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_108);
                  }
                }
                local_d0.data_ = (AssertHelperData *)0x0;
                local_64 = i2d_PKCS7((PKCS7 *)local_c8._M_head_impl,(uchar **)&local_d0);
                local_130 = (undefined1  [8])((ulong)local_130 & 0xffffffff00000000);
                testing::internal::CmpHelperGT<int,int>
                          ((internal *)local_110,"result3_len","0",&local_64,(int *)local_130);
                if (local_110[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_130);
                  if (local_108 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    pcVar10 = "";
                  }
                  else {
                    pcVar10 = (char *)local_108->_M_allocated_capacity;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_120,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                             ,0x91,pcVar10);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_120,(Message *)local_130);
                  goto LAB_0033c674;
                }
                if (local_108 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_108,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_108);
                }
                local_50._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                     (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
                     (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
                     local_d0.data_;
                local_130 = (undefined1  [8])local_60;
                local_120.span_.size_ = (size_t)local_64;
                local_120.span_.data_ = (uchar *)local_d0.data_;
                local_128._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )initial_capacity.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
                testing::internal::CmpHelperEQ<Bytes,Bytes>
                          ((internal *)local_110,"Bytes(der)","Bytes(result3_data, result3_len)",
                           (Bytes *)local_130,&local_120);
                if (local_110[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_130);
                  if (local_108 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    pcVar10 = "";
                  }
                  else {
                    pcVar10 = (char *)local_108->_M_allocated_capacity;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_120,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                             ,0x93,pcVar10);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_120,(Message *)local_130);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
                  if (local_130 != (undefined1  [8])0x0) {
                    (**(code **)(*(long *)local_130 + 8))();
                  }
                }
                if (local_108 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_108,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_108);
                }
                __p = PKCS7_sign((X509 *)0x0,(EVP_PKEY *)0x0,(stack_st_X509 *)local_e0._M_head_impl,
                                 (BIO *)0x0,0x40);
                std::__uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<PKCS7,_bssl::internal::Deleter> *)&local_c8,(pointer)__p
                          );
                local_130[0] = (PKCS7 *)local_c8._M_head_impl != (PKCS7 *)0x0;
                local_128._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                if ((PKCS7 *)local_c8._M_head_impl == (PKCS7 *)0x0) {
                  testing::Message::Message((Message *)&local_120);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_110,(internal *)local_130,
                             (AssertionResult *)"pkcs7_obj","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_d8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                             ,0x98,(char *)local_110);
                  testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_120);
LAB_0033c93c:
                  pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_128;
                  testing::internal::AssertHelper::~AssertHelper(&local_d8);
                  if (local_110 != (undefined1  [8])&local_100) {
                    operator_delete((void *)local_110,local_100._M_allocated_capacity + 1);
                  }
                  if ((AssertHelperData *)local_120.span_.data_ != (AssertHelperData *)0x0) {
                    (**(code **)(*(long *)local_120.span_.data_ + 8))();
                  }
                  _Var6._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )local_128;
                  if (local_128._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl !=
                      (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
LAB_0033cb7c:
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()(pdVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)_Var6._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl);
                  }
                }
                else {
                  iVar2 = PKCS7_type_is_signed(local_c8._M_head_impl);
                  local_130[0] = iVar2 != 0;
                  local_128._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  if (iVar2 == 0) {
                    testing::Message::Message((Message *)&local_120);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_110,(internal *)local_130,
                               (AssertionResult *)"PKCS7_type_is_signed(pkcs7_obj.get())","false",
                               "true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_d8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                               ,0x9a,(char *)local_110);
                    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_120);
                    goto LAB_0033c93c;
                  }
                  pOVar1 = (OPENSSL_STACK *)((ASN1_OBJECT *)((local_c8._M_head_impl)->d).sign)->sn;
                  local_130 = (undefined1  [8])
                              OPENSSL_sk_num((OPENSSL_STACK *)local_e0._M_head_impl);
                  local_120.span_.data_ = (uchar *)OPENSSL_sk_num(pOVar1);
                  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                            ((internal *)local_110,"sk_X509_num(certs.get())","sk_X509_num(certs4)",
                             (unsigned_long *)local_130,(unsigned_long *)&local_120);
                  if (local_110[0] == (internal)0x0) {
                    testing::Message::Message((Message *)local_130);
                    if (local_108 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      pcVar10 = "";
                    }
                    else {
                      pcVar10 = (char *)local_108->_M_allocated_capacity;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_120,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                               ,0x9c,pcVar10);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_120,(Message *)local_130);
LAB_0033cb53:
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
                    if (local_130 != (undefined1  [8])0x0) {
                      (**(code **)(*(long *)local_130 + 8))();
                    }
                    if (local_108 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) goto LAB_0033cb81;
                    pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_108;
                    _Var6._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )local_108;
                    goto LAB_0033cb7c;
                  }
                  if (local_108 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_108,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_108);
                  }
                  for (uVar11 = 0; sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)local_e0._M_head_impl),
                      uVar11 < sVar3; uVar11 = uVar11 + 1) {
                    pXVar4 = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)local_e0._M_head_impl,uVar11)
                    ;
                    pXVar5 = (X509 *)OPENSSL_sk_value(pOVar1,uVar11);
                    local_130 = (undefined1  [8])((ulong)local_130 & 0xffffffff00000000);
                    iVar2 = X509_cmp(pXVar4,pXVar5);
                    local_120.span_.data_ = (uchar *)CONCAT44(local_120.span_.data_._4_4_,iVar2);
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)local_110,"0","X509_cmp(a, b)",(int *)local_130,
                               (int *)&local_120);
                    if (local_110[0] == (internal)0x0) {
                      testing::Message::Message((Message *)local_130);
                      if (local_108 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
                        pcVar10 = "";
                      }
                      else {
                        pcVar10 = (char *)local_108->_M_allocated_capacity;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_120,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                 ,0xa0,pcVar10);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_120,(Message *)local_130);
                      goto LAB_0033cb53;
                    }
                    if (local_108 !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_108,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_108);
                    }
                  }
                  local_d8.data_ = (AssertHelperData *)0x0;
                  local_68 = i2d_PKCS7((PKCS7 *)local_c8._M_head_impl,(uchar **)&local_d8);
                  local_130 = (undefined1  [8])((ulong)local_130 & 0xffffffff00000000);
                  testing::internal::CmpHelperGT<int,int>
                            ((internal *)local_110,"result4_len","0",&local_68,(int *)local_130);
                  if (local_110[0] == (internal)0x0) {
                    testing::Message::Message((Message *)local_130);
                    if (local_108 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      pcVar10 = "";
                    }
                    else {
                      pcVar10 = (char *)local_108->_M_allocated_capacity;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_120,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                               ,0xa6,pcVar10);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_120,(Message *)local_130);
                    goto LAB_0033cb53;
                  }
                  if (local_108 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_108,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_108);
                  }
                  local_58._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
                       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
                       local_d8.data_;
                  local_130 = (undefined1  [8])local_70._M_head_impl;
                  local_128._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )local_78;
                  local_120.span_.size_ = (size_t)local_68;
                  local_120.span_.data_ = (uchar *)local_d8.data_;
                  testing::internal::CmpHelperEQ<Bytes,Bytes>
                            ((internal *)local_110,"Bytes(result_data, result_len)",
                             "Bytes(result4_data, result4_len)",(Bytes *)local_130,&local_120);
                  if (local_110[0] == (internal)0x0) {
                    testing::Message::Message((Message *)local_130);
                    if (local_108 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      pcVar10 = "";
                    }
                    else {
                      pcVar10 = (char *)local_108->_M_allocated_capacity;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_120,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                               ,0xa8,pcVar10);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_120,(Message *)local_130);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
                    if (local_130 != (undefined1  [8])0x0) {
                      (**(code **)(*(long *)local_130 + 8))();
                    }
                  }
                  if (local_108 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_108,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_108);
                  }
                  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_58);
                }
LAB_0033cb81:
                std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_50);
              }
LAB_0033c6a2:
              std::unique_ptr<PKCS7,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<PKCS7,_bssl::internal::Deleter> *)&local_c8);
              std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_f0);
              goto LAB_0033c038;
            }
            testing::Message::Message((Message *)&local_120);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_110,(internal *)local_130,
                       (AssertionResult *)"CBB_finish(cbb.get(), &result2_data, &result2_len)",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_f0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                       ,0x79,(char *)local_110);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_f0,(Message *)&local_120);
          }
        }
LAB_0033bc48:
        pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_128;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
        if (local_110 != (undefined1  [8])&local_100) {
          operator_delete((void *)local_110,local_100._M_allocated_capacity + 1);
        }
        if ((AssertHelperData *)local_120.span_.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_120.span_.data_ + 8))();
        }
        _Var6._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )local_128;
        if (local_128._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
            (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
LAB_0033c033:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(pdVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              _Var6._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
        }
      }
LAB_0033c038:
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_e8);
    }
    CBB_cleanup((CBB *)local_a8);
  }
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&local_c0);
LAB_0033c059:
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&local_e0);
  return;
}

Assistant:

static void TestCertReparse(bssl::Span<const uint8_t> der) {
  bssl::UniquePtr<STACK_OF(X509)> certs(sk_X509_new_null());
  ASSERT_TRUE(certs);
  bssl::UniquePtr<STACK_OF(X509)> certs2(sk_X509_new_null());
  ASSERT_TRUE(certs2);
  uint8_t *result_data, *result2_data;
  size_t result_len, result2_len;

  CBS pkcs7 = der;
  ASSERT_TRUE(PKCS7_get_certificates(certs.get(), &pkcs7));
  EXPECT_EQ(0u, CBS_len(&pkcs7));

  bssl::ScopedCBB cbb;
  ASSERT_TRUE(CBB_init(cbb.get(), der.size()));
  ASSERT_TRUE(PKCS7_bundle_certificates(cbb.get(), certs.get()));
  ASSERT_TRUE(CBB_finish(cbb.get(), &result_data, &result_len));
  bssl::UniquePtr<uint8_t> free_result_data(result_data);

  CBS_init(&pkcs7, result_data, result_len);
  ASSERT_TRUE(PKCS7_get_certificates(certs2.get(), &pkcs7));
  EXPECT_EQ(0u, CBS_len(&pkcs7));

  // PKCS#7 stores certificates in a SET OF, so |PKCS7_bundle_certificates| may
  // not preserve the original order. All of our test inputs are already sorted,
  // but this check should be relaxed if we add others.
  ASSERT_EQ(sk_X509_num(certs.get()), sk_X509_num(certs2.get()));
  for (size_t i = 0; i < sk_X509_num(certs.get()); i++) {
    X509 *a = sk_X509_value(certs.get(), i);
    X509 *b = sk_X509_value(certs2.get(), i);
    ASSERT_EQ(0, X509_cmp(a, b));
  }

  ASSERT_TRUE(CBB_init(cbb.get(), der.size()));
  ASSERT_TRUE(PKCS7_bundle_certificates(cbb.get(), certs2.get()));
  ASSERT_TRUE(CBB_finish(cbb.get(), &result2_data, &result2_len));
  bssl::UniquePtr<uint8_t> free_result2_data(result2_data);

  EXPECT_EQ(Bytes(result_data, result_len), Bytes(result2_data, result2_len));

  // Parse with the legacy API instead.
  const uint8_t *ptr = der.data();
  bssl::UniquePtr<PKCS7> pkcs7_obj(d2i_PKCS7(nullptr, &ptr, der.size()));
  ASSERT_TRUE(pkcs7_obj);
  EXPECT_EQ(ptr, der.data() + der.size());

  ASSERT_TRUE(PKCS7_type_is_signed(pkcs7_obj.get()));
  const STACK_OF(X509) *certs3 = pkcs7_obj->d.sign->cert;
  ASSERT_EQ(sk_X509_num(certs.get()), sk_X509_num(certs3));
  for (size_t i = 0; i < sk_X509_num(certs.get()); i++) {
    X509 *a = sk_X509_value(certs.get(), i);
    X509 *b = sk_X509_value(certs3, i);
    ASSERT_EQ(0, X509_cmp(a, b));
  }

  // Serialize the original object. This should echo back the original saved
  // bytes.
  uint8_t *result3_data = nullptr;
  int result3_len = i2d_PKCS7(pkcs7_obj.get(), &result3_data);
  ASSERT_GT(result3_len, 0);
  bssl::UniquePtr<uint8_t> free_result3_data(result3_data);
  EXPECT_EQ(Bytes(der), Bytes(result3_data, result3_len));

  // Make a new object with the legacy API.
  pkcs7_obj.reset(
      PKCS7_sign(nullptr, nullptr, certs.get(), nullptr, PKCS7_DETACHED));
  ASSERT_TRUE(pkcs7_obj);

  ASSERT_TRUE(PKCS7_type_is_signed(pkcs7_obj.get()));
  const STACK_OF(X509) *certs4 = pkcs7_obj->d.sign->cert;
  ASSERT_EQ(sk_X509_num(certs.get()), sk_X509_num(certs4));
  for (size_t i = 0; i < sk_X509_num(certs.get()); i++) {
    X509 *a = sk_X509_value(certs.get(), i);
    X509 *b = sk_X509_value(certs4, i);
    ASSERT_EQ(0, X509_cmp(a, b));
  }

  // This new object should serialize canonically.
  uint8_t *result4_data = nullptr;
  int result4_len = i2d_PKCS7(pkcs7_obj.get(), &result4_data);
  ASSERT_GT(result4_len, 0);
  bssl::UniquePtr<uint8_t> free_result4_data(result4_data);
  EXPECT_EQ(Bytes(result_data, result_len), Bytes(result4_data, result4_len));
}